

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::DescriptorScriptPubKeyMan::AddDescriptorKey
          (DescriptorScriptPubKeyMan *this,CKey *key,CPubKey *pubkey)

{
  undefined1 uVar1;
  runtime_error *this_00;
  allocator<char> *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CPubKey *unaff_retaddr;
  CKey *in_stack_00000008;
  WalletBatch *in_stack_00000010;
  DescriptorScriptPubKeyMan *in_stack_00000018;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  WalletDatabase *in_stack_ffffffffffffff40;
  WalletBatch *in_stack_ffffffffffffff48;
  char *__rhs;
  undefined7 in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char local_69 [65];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDX,in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  (**(code **)(*(long *)in_RDI->_M_string_length + 0x18))();
  WalletBatch::WalletBatch
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
  uVar1 = AddDescriptorKeyWithDB
                    (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if ((bool)uVar1) {
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,in_RSI,in_RDX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff50),__rhs);
    std::runtime_error::runtime_error(this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::AddDescriptorKey(const CKey& key, const CPubKey &pubkey)
{
    LOCK(cs_desc_man);
    WalletBatch batch(m_storage.GetDatabase());
    if (!AddDescriptorKeyWithDB(batch, key, pubkey)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor private key failed");
    }
}